

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrappers.c
# Opt level: O0

size_t wrapped_fwrite(void *ptr,size_t size,size_t nmemb,FILE *stream)

{
  int fd;
  long lVar1;
  code *pcVar2;
  size_t return_val;
  curious_write_record_t io_args;
  curious_file_record_t *record;
  char *mount_point;
  char *filesystem;
  fwrite_f orig_fwrite;
  FILE *stream_local;
  size_t nmemb_local;
  size_t size_local;
  void *ptr_local;
  
  lVar1 = __tls_get_addr(&PTR_00550710);
  *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + 1;
  pcVar2 = (code *)gotcha_get_wrappee(io_fns[0x23].handle);
  lVar1 = __tls_get_addr(&PTR_00550710);
  if ((*(int *)(lVar1 + 0xc) == 1) && (wrappers_enabled != 0)) {
    fd = fileno((FILE *)stream);
    io_args._32_8_ = get_curious_file_record(fd);
    if ((curious_file_record_t *)io_args._32_8_ == (curious_file_record_t *)0x0) {
      mount_point = (char *)0x0;
      record = (curious_file_record_t *)0x0;
    }
    else {
      mount_point = ((curious_file_record_t *)io_args._32_8_)->filesystem;
      record = (curious_file_record_t *)((curious_file_record_t *)io_args._32_8_)->mount_point;
    }
    return_val = 0;
    io_args.bytes_written._0_4_ = 0;
    io_args._8_8_ = mount_point;
    io_args.filesystem = (char *)record;
    io_args.mount_point._0_4_ = 0x23;
    curious_call_callbacks(2,&return_val);
    ptr_local = (void *)(*pcVar2)(ptr,size,nmemb,stream);
    io_args.bytes_written._0_4_ = 1;
    if (ptr_local != (void *)0x0) {
      return_val = (long)ptr_local * size;
    }
    curious_call_callbacks(3,&return_val);
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
  }
  else {
    lVar1 = __tls_get_addr(&PTR_00550710);
    *(int *)(lVar1 + 0xc) = *(int *)(lVar1 + 0xc) + -1;
    ptr_local = (void *)(*pcVar2)(ptr,size,nmemb,stream);
  }
  return (size_t)ptr_local;
}

Assistant:

size_t wrapped_fwrite(void* ptr, size_t size, size_t nmemb, FILE* stream)
{
    WRAPPER_ENTER(fwrite);

    // Get the handle for the original function
    fwrite_f orig_fwrite = (fwrite_f) gotcha_get_wrappee(io_fns[CURIOUS_FWRITE_ID].handle);

    // Only call callbacks the first time around
    if (1 == wrapper_call_depth && wrappers_enabled) {
        char*                  filesystem;
        char*                  mount_point;
        curious_file_record_t* record = get_curious_file_record(fileno(stream));
        if (NULL == record) {
            filesystem  = NULL;
            mount_point = NULL;
        } else {
            filesystem  = record->filesystem;
            mount_point = record->mount_point;
        }

        curious_write_record_t io_args = {
            .bytes_written = 0,
            .call_count    = 0,
            .filesystem    = filesystem,
            .mount_point   = mount_point,
            .function_id   = CURIOUS_FWRITE_ID,
        };
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK, &io_args);

        // Call the original, saving the result...
        size_t return_val  = orig_fwrite(ptr, size, nmemb, stream);
        io_args.call_count = 1;
        if (0 < return_val) {
            io_args.bytes_written = return_val * size;
        }

        //...for the pot callbacks to use
        curious_call_callbacks(CURIOUS_WRITE_CALLBACK | CURIOUS_POST_CALLBACK, &io_args);

        WRAPPER_RETURN(return_val, fwrite);

        // and just call the original function every other time
    } else {
        WRAPPER_RETURN(orig_fwrite(ptr, size, nmemb, stream), fwrite);
    }
}